

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

QVariant * __thiscall QLineEdit::inputMethodQuery(QLineEdit *this,InputMethodQuery property)

{
  QVariant *in_RDI;
  long in_FS_OFFSET;
  InputMethodQuery in_stack_0000003c;
  QLineEdit *in_stack_00000040;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::QVariant((QVariant *)0x5c6a61);
  inputMethodQuery(in_stack_00000040,in_stack_0000003c,(QVariant *)this);
  ::QVariant::~QVariant(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QLineEdit::inputMethodQuery(Qt::InputMethodQuery property) const
{
#ifdef Q_OS_ANDROID
    // QTBUG-61652
    if (property == Qt::ImEnterKeyType) {
        QWidget *next = nextInFocusChain();
        while (next && next != this && next->focusPolicy() == Qt::NoFocus)
            next = next->nextInFocusChain();
        if (next) {
            const auto nextYPos = next->mapToGlobal(QPoint(0, 0)).y();
            const auto currentYPos = mapToGlobal(QPoint(0, 0)).y();
            if (currentYPos < nextYPos)
                // Set EnterKey to KeyNext type only if the next widget
                // in the focus chain is below current QLineEdit
                return Qt::EnterKeyNext;
        }
    }
#endif
    return inputMethodQuery(property, QVariant());
}